

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void * __thiscall
llvm::AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Allocate
          (AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_> *this,
          size_t Size,size_t Alignment)

{
  void *pvVar1;
  size_t Alignment_local;
  size_t Size_local;
  AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_> *this_local;
  
  pvVar1 = BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                     ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)this,Size,
                      Alignment);
  return pvVar1;
}

Assistant:

void *Allocate(size_t Size, size_t Alignment) {
#ifdef __clang__
    static_assert(static_cast<void *(AllocatorBase::*)(size_t, size_t)>(
                      &AllocatorBase::Allocate) !=
                      static_cast<void *(DerivedT::*)(size_t, size_t)>(
                          &DerivedT::Allocate),
                  "Class derives from AllocatorBase without implementing the "
                  "core Allocate(size_t, size_t) overload!");
#endif
    return static_cast<DerivedT *>(this)->Allocate(Size, Alignment);
  }